

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMPIRToDOT.cpp
# Opt level: O3

void __thiscall
OpenMPDefaultClause::generateDOT
          (OpenMPDefaultClause *this,ofstream *dot_file,int depth,int index,string *parent_node)

{
  pointer pcVar1;
  OpenMPDirective *this_00;
  char *pcVar2;
  ofstream *dot_file_00;
  uint uVar3;
  long *plVar4;
  undefined8 *puVar5;
  size_t sVar6;
  uint uVar7;
  long *plVar8;
  ulong *puVar9;
  ulong uVar10;
  uint uVar11;
  undefined8 uVar12;
  uint uVar13;
  string clause_string;
  string __str;
  string __str_1;
  string indent;
  string current_line;
  string parameter_string;
  ulong *local_200;
  long local_1f8;
  ulong local_1f0;
  long lStack_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  long *local_1c0;
  undefined8 local_1b8;
  long local_1b0;
  undefined8 uStack_1a8;
  long *local_1a0;
  undefined8 local_198;
  long local_190;
  undefined8 uStack_188;
  undefined1 *local_180;
  char *local_178;
  undefined1 local_170;
  undefined7 uStack_16f;
  ulong *local_160;
  long local_158;
  ulong local_150 [2];
  long *local_140 [2];
  long local_130 [2];
  ulong *local_120;
  long local_118;
  ulong local_110 [2];
  long *local_100;
  long local_f8;
  long local_f0;
  long lStack_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  char *local_c0;
  undefined8 local_b8;
  char local_b0;
  undefined7 uStack_af;
  OpenMPDefaultClause *local_a0;
  ofstream *local_98;
  string local_90;
  string local_70;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40;
  undefined7 uStack_3f;
  
  local_50 = &local_40;
  local_48 = 0;
  local_40 = 0;
  local_c0 = &local_b0;
  local_b8 = 0;
  local_b0 = '\0';
  local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_e0,(char)depth);
  local_180 = &local_170;
  local_178 = (char *)0x0;
  local_170 = 0;
  std::__cxx11::string::substr((ulong)&local_1a0,(ulong)parent_node);
  local_a0 = this;
  std::__cxx11::string::operator=((string *)parent_node,(string *)&local_1a0);
  if (local_1a0 != &local_190) {
    operator_delete(local_1a0,local_190 + 1);
  }
  std::__cxx11::string::_M_replace((ulong)&local_180,0,local_178,0x1a5ef2);
  local_140[0] = local_130;
  pcVar1 = (parent_node->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_140,pcVar1,pcVar1 + parent_node->_M_string_length);
  std::__cxx11::string::append((char *)local_140);
  plVar4 = (long *)std::__cxx11::string::_M_append((char *)local_140,(ulong)local_180);
  local_100 = &local_f0;
  plVar8 = plVar4 + 2;
  if ((long *)*plVar4 == plVar8) {
    local_f0 = *plVar8;
    lStack_e8 = plVar4[3];
  }
  else {
    local_f0 = *plVar8;
    local_100 = (long *)*plVar4;
  }
  local_f8 = plVar4[1];
  *plVar4 = (long)plVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_100);
  local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
  puVar9 = (ulong *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar9) {
    local_1e0.field_2._M_allocated_capacity = *puVar9;
    local_1e0.field_2._8_8_ = plVar4[3];
  }
  else {
    local_1e0.field_2._M_allocated_capacity = *puVar9;
    local_1e0._M_dataplus._M_p = (pointer)*plVar4;
  }
  local_1e0._M_string_length = plVar4[1];
  *plVar4 = (long)puVar9;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  uVar11 = -depth;
  if (0 < depth) {
    uVar11 = depth;
  }
  uVar13 = 1;
  if (9 < uVar11) {
    uVar10 = (ulong)uVar11;
    uVar3 = 4;
    do {
      uVar13 = uVar3;
      uVar7 = (uint)uVar10;
      if (uVar7 < 100) {
        uVar13 = uVar13 - 2;
        goto LAB_0016688b;
      }
      if (uVar7 < 1000) {
        uVar13 = uVar13 - 1;
        goto LAB_0016688b;
      }
      if (uVar7 < 10000) goto LAB_0016688b;
      uVar10 = uVar10 / 10000;
      uVar3 = uVar13 + 4;
    } while (99999 < uVar7);
    uVar13 = uVar13 + 1;
  }
LAB_0016688b:
  local_160 = local_150;
  local_98 = dot_file;
  std::__cxx11::string::_M_construct((ulong)&local_160,(char)uVar13 - (char)(depth >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)((uint)depth >> 0x1f) + (long)local_160),uVar13,uVar11);
  uVar12 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    uVar12 = local_1e0.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar12 < local_158 + local_1e0._M_string_length) {
    uVar10 = 0xf;
    if (local_160 != local_150) {
      uVar10 = local_150[0];
    }
    if (uVar10 < local_158 + local_1e0._M_string_length) goto LAB_0016691f;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)&local_160,0,(char *)0x0,(ulong)local_1e0._M_dataplus._M_p);
  }
  else {
LAB_0016691f:
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1e0,(ulong)local_160);
  }
  local_1c0 = &local_1b0;
  plVar4 = puVar5 + 2;
  if ((long *)*puVar5 == plVar4) {
    local_1b0 = *plVar4;
    uStack_1a8 = puVar5[3];
  }
  else {
    local_1b0 = *plVar4;
    local_1c0 = (long *)*puVar5;
  }
  local_1b8 = puVar5[1];
  *puVar5 = plVar4;
  puVar5[1] = 0;
  *(undefined1 *)plVar4 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_1c0);
  local_200 = &local_1f0;
  puVar9 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar9) {
    local_1f0 = *puVar9;
    lStack_1e8 = plVar4[3];
  }
  else {
    local_1f0 = *puVar9;
    local_200 = (ulong *)*plVar4;
  }
  local_1f8 = plVar4[1];
  *plVar4 = (long)puVar9;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  uVar11 = -index;
  if (0 < index) {
    uVar11 = index;
  }
  uVar13 = 1;
  if (9 < uVar11) {
    uVar10 = (ulong)uVar11;
    uVar3 = 4;
    do {
      uVar13 = uVar3;
      uVar7 = (uint)uVar10;
      if (uVar7 < 100) {
        uVar13 = uVar13 - 2;
        goto LAB_00166a36;
      }
      if (uVar7 < 1000) {
        uVar13 = uVar13 - 1;
        goto LAB_00166a36;
      }
      if (uVar7 < 10000) goto LAB_00166a36;
      uVar10 = uVar10 / 10000;
      uVar3 = uVar13 + 4;
    } while (99999 < uVar7);
    uVar13 = uVar13 + 1;
  }
LAB_00166a36:
  local_120 = local_110;
  std::__cxx11::string::_M_construct((ulong)&local_120,(char)uVar13 - (char)(index >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)((uint)index >> 0x1f) + (long)local_120),uVar13,uVar11);
  dot_file_00 = local_98;
  uVar10 = 0xf;
  if (local_200 != &local_1f0) {
    uVar10 = local_1f0;
  }
  if (uVar10 < (ulong)(local_118 + local_1f8)) {
    uVar10 = 0xf;
    if (local_120 != local_110) {
      uVar10 = local_110[0];
    }
    if ((ulong)(local_118 + local_1f8) <= uVar10) {
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_120,0,(char *)0x0,(ulong)local_200);
      goto LAB_00166ae9;
    }
  }
  puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_200,(ulong)local_120);
LAB_00166ae9:
  plVar4 = puVar5 + 2;
  if ((long *)*puVar5 == plVar4) {
    local_190 = *plVar4;
    uStack_188 = puVar5[3];
    local_1a0 = &local_190;
  }
  else {
    local_190 = *plVar4;
    local_1a0 = (long *)*puVar5;
  }
  local_198 = puVar5[1];
  *puVar5 = plVar4;
  puVar5[1] = 0;
  *(undefined1 *)plVar4 = 0;
  std::__cxx11::string::operator=((string *)&local_180,(string *)&local_1a0);
  if (local_1a0 != &local_190) {
    operator_delete(local_1a0,local_190 + 1);
  }
  if (local_120 != local_110) {
    operator_delete(local_120,local_110[0] + 1);
  }
  if (local_200 != &local_1f0) {
    operator_delete(local_200,local_1f0 + 1);
  }
  if (local_1c0 != &local_1b0) {
    operator_delete(local_1c0,local_1b0 + 1);
  }
  if (local_160 != local_150) {
    operator_delete(local_160,local_150[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
  }
  if (local_100 != &local_f0) {
    operator_delete(local_100,local_f0 + 1);
  }
  if (local_140[0] != local_130) {
    operator_delete(local_140[0],local_130[0] + 1);
  }
  std::operator+(&local_1e0,&local_e0,parent_node);
  puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_1e0);
  plVar4 = puVar5 + 2;
  if ((long *)*puVar5 == plVar4) {
    local_1b0 = *plVar4;
    uStack_1a8 = puVar5[3];
    local_1c0 = &local_1b0;
  }
  else {
    local_1b0 = *plVar4;
    local_1c0 = (long *)*puVar5;
  }
  local_1b8 = puVar5[1];
  *puVar5 = plVar4;
  puVar5[1] = 0;
  *(undefined1 *)(puVar5 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::_M_append((char *)&local_1c0,(ulong)local_180);
  local_200 = &local_1f0;
  puVar9 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar9) {
    local_1f0 = *puVar9;
    lStack_1e8 = plVar4[3];
  }
  else {
    local_1f0 = *puVar9;
    local_200 = (ulong *)*plVar4;
  }
  local_1f8 = plVar4[1];
  *plVar4 = (long)puVar9;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_200);
  plVar4 = puVar5 + 2;
  if ((long *)*puVar5 == plVar4) {
    local_190 = *plVar4;
    uStack_188 = puVar5[3];
    local_1a0 = &local_190;
  }
  else {
    local_190 = *plVar4;
    local_1a0 = (long *)*puVar5;
  }
  local_198 = puVar5[1];
  *puVar5 = plVar4;
  puVar5[1] = 0;
  *(undefined1 *)(puVar5 + 2) = 0;
  std::__cxx11::string::operator=((string *)&local_c0,(string *)&local_1a0);
  if (local_1a0 != &local_190) {
    operator_delete(local_1a0,local_190 + 1);
  }
  if (local_200 != &local_1f0) {
    operator_delete(local_200,local_1f0 + 1);
  }
  if (local_1c0 != &local_1b0) {
    operator_delete(local_1c0,local_1b0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
  }
  pcVar2 = local_c0;
  if (local_c0 == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(*(long *)dot_file_00 + -0x18) + (int)dot_file_00);
  }
  else {
    sVar6 = strlen(local_c0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)dot_file_00,pcVar2,sVar6);
  }
  std::__cxx11::string::append((char *)&local_e0);
  this_00 = local_a0->variant_directive;
  if (this_00 != (OpenMPDirective *)0x0) {
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,local_180,local_178 + (long)local_180);
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"");
    OpenMPDirective::generateDOT(this_00,dot_file_00,depth + 1,0,&local_70,&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
  }
  if (local_180 != &local_170) {
    operator_delete(local_180,CONCAT71(uStack_16f,local_170) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  if (local_c0 != &local_b0) {
    operator_delete(local_c0,CONCAT71(uStack_af,local_b0) + 1);
  }
  if (local_50 != &local_40) {
    operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
  }
  return;
}

Assistant:

void OpenMPDefaultClause::generateDOT(std::ofstream& dot_file, int depth, int index, std::string parent_node) {

    std::string parameter_string;
    OpenMPDirective* variant_directive = NULL;
    std::string current_line;
    std::string indent = std::string(depth, '\t');
    std::string clause_string;
    //std::vector<OpenMPDirective*>* parameter_directives;
    parent_node = parent_node.substr(0, parent_node.size()-1);
    //OpenMPClauseKind clause_kind = this->getKind();

    clause_string = "default";

    clause_string = parent_node + "_" + clause_string + "_" + std::to_string(depth) + "_" + std::to_string(index);
    current_line = indent + parent_node + " -- " + clause_string + "\n";
    dot_file << current_line.c_str();
    indent += "\t";
    variant_directive = ((OpenMPDefaultClause*)this)->getVariantDirective();
    if (variant_directive != NULL) {
        variant_directive->generateDOT(dot_file, depth+1, 0, clause_string, "");
    };
}